

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
* __thiscall
Catch::ExprLhs<std::vector<unsigned_int,std::allocator<unsigned_int>>const&>::operator==
          (ExprLhs<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rhs)

{
  StringRef op;
  bool comparisonResult;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
  *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  pointer puVar1;
  BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
  *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                 (in_RSI,in_stack_ffffffffffffffa8);
  puVar1 = (in_RSI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = (char *)puVar1;
  BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
  ::BinaryExpr(in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }